

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

size_t __thiscall
proto2_unittest::TestOneof2_NestedMessage::ByteSizeLong(TestOneof2_NestedMessage *this)

{
  uint uVar1;
  int size;
  RepeatedField<int> *value;
  size_t sVar2;
  uint32_t *puVar3;
  int64_t value_00;
  size_t tag_size;
  size_t data_size;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  TestOneof2_NestedMessage *this_;
  TestOneof2_NestedMessage *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  value = _internal_corge_int(this);
  sVar2 = google::protobuf::internal::WireFormatLite::Int32Size(value);
  size = _internal_corge_int_size(this);
  sStack_58 = google::protobuf::internal::FromIntSize(size);
  sStack_58 = sStack_58 + sVar2;
  puVar3 = google::protobuf::internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 3) != 0) {
    if ((uVar1 & 1) != 0) {
      sVar2 = google::protobuf::internal::WireFormatLite::
              MessageSize<proto2_unittest::TestOneof2_NestedMessage>((this->field_0)._impl_.child_);
      sStack_58 = sVar2 + 1 + sStack_58;
    }
    if ((uVar1 & 2) != 0) {
      value_00 = _internal_moo_int(this);
      sVar2 = google::protobuf::internal::WireFormatLite::Int64SizePlusOne(value_00);
      sStack_58 = sVar2 + sStack_58;
    }
  }
  sVar2 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar2;
}

Assistant:

::size_t TestOneof2_NestedMessage::ByteSizeLong() const {
  const TestOneof2_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestOneof2.NestedMessage)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 corge_int = 2;
    {
      ::size_t data_size = ::_pbi::WireFormatLite::Int32Size(
          this_._internal_corge_int());
      ::size_t tag_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_corge_int_size());
      total_size += tag_size + data_size;
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x00000003u) != 0) {
    // .proto2_unittest.TestOneof2.NestedMessage child = 3;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.child_);
    }
    // int64 moo_int = 1;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += ::_pbi::WireFormatLite::Int64SizePlusOne(
          this_._internal_moo_int());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}